

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

long find_field(char *field_name,FMFieldList fields,int cur_field,void *search_help)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int i;
  int local_2c;
  
  if (10 < in_EDX) {
    for (local_2c = in_EDX + -1; in_EDX + -10 < local_2c; local_2c = local_2c + -1) {
      iVar1 = strcmp(in_RDI,*(char **)(in_RSI + (long)local_2c * 0x18));
      if (iVar1 == 0) {
        return (long)local_2c;
      }
    }
    local_2c = in_EDX + 1;
    while ((local_2c < in_EDX + 10 && (*(long *)(in_RSI + (long)local_2c * 0x18) != 0))) {
      iVar1 = strcmp(in_RDI,*(char **)(in_RSI + (long)local_2c * 0x18));
      if (iVar1 == 0) {
        return (long)local_2c;
      }
      local_2c = local_2c + 1;
    }
  }
  local_2c = 0;
  while( true ) {
    if (*(long *)(in_RSI + (long)local_2c * 0x18) == 0) {
      return -1;
    }
    iVar1 = strcmp(in_RDI,*(char **)(in_RSI + (long)local_2c * 0x18));
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return (long)local_2c;
}

Assistant:

static long
find_field(char *field_name, FMFieldList fields, int cur_field, void *search_help)
{
    int i;
    if (cur_field > 10) {
      /* search close first */
      for (i = cur_field -1; i > cur_field - 10; i--) {
	if (strcmp(field_name, fields[i].field_name) == 0) {
	    return i;
	}
      }
      for (i = cur_field + 1; i < cur_field + 10; i++) {
	if (fields[i].field_name == NULL) break;
	if (strcmp(field_name, fields[i].field_name) == 0) {
	    return i;
	}
      }
    }
    i = 0;
    while (fields[i].field_name != NULL) {
	if (strcmp(field_name, fields[i].field_name) == 0) {
	    return i;
	}
	i++;
    }
    return -1;
}